

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BendTypeParser.cpp
# Opt level: O2

BendType * __thiscall
OpenMD::BendTypeParser::parseLine(BendTypeParser *this,string *line,RealType kScale)

{
  uint uVar1;
  BendTypeEnum BVar2;
  int iVar3;
  int mAtt;
  SDKBendType *this_00;
  PolynomialBendType *this_01;
  _Rb_tree_header *p_Var4;
  OpenMDException *pOVar5;
  bool bVar6;
  RealType RVar7;
  _func_int **pp_Var8;
  allocator<char> local_d1;
  RealType local_d0;
  RealType local_c8;
  _func_int **local_c0;
  string local_b8;
  RealType local_98;
  RealType local_90;
  StringTokenizer tokenizer;
  
  local_c8 = kScale;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8," ;\t\n\r",&local_d1);
  StringTokenizer::StringTokenizer(&tokenizer,line,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  uVar1 = StringTokenizer::countTokens(&tokenizer);
  if ((int)uVar1 < 2) {
    pOVar5 = (OpenMDException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,"BendTypeParser: Not enough tokens",&local_d1);
    OpenMDException::OpenMDException(pOVar5,&local_b8);
    __cxa_throw(pOVar5,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
  }
  StringTokenizer::nextToken_abi_cxx11_(&local_b8,&tokenizer);
  BVar2 = getBendTypeEnum(this,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  switch(BVar2) {
  case btHarmonic:
    if (uVar1 == 2) {
      pOVar5 = (OpenMDException *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,"BendTypeParser: Not enough tokens",&local_d1);
      OpenMDException::OpenMDException(pOVar5,&local_b8);
      __cxa_throw(pOVar5,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
    }
    local_d0 = StringTokenizer::nextTokenAsDouble(&tokenizer);
    local_c0 = (_func_int **)StringTokenizer::nextTokenAsDouble(&tokenizer);
    this_00 = (SDKBendType *)operator_new(0x18);
    goto LAB_001a8e66;
  case btGhostBend:
    if (uVar1 == 2) {
      pOVar5 = (OpenMDException *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,"BendTypeParser: Not enough tokens",&local_d1);
      OpenMDException::OpenMDException(pOVar5,&local_b8);
      __cxa_throw(pOVar5,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
    }
    local_d0 = StringTokenizer::nextTokenAsDouble(&tokenizer);
    local_c0 = (_func_int **)StringTokenizer::nextTokenAsDouble(&tokenizer);
    this_00 = (SDKBendType *)operator_new(0x18);
LAB_001a8e66:
    (this_00->super_HarmonicBendType).super_BendType.theta0_ = local_d0 * 0.017453292519943295;
    (this_00->super_HarmonicBendType).super_BendType._vptr_BendType =
         (_func_int **)&PTR__BendType_002beb70;
    (this_00->super_HarmonicBendType).k_ = (double)local_c0 * local_c8;
    break;
  case btUreyBradley:
    if (uVar1 < 5) {
      pOVar5 = (OpenMDException *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,"BendTypeParser: Not enough tokens",&local_d1);
      OpenMDException::OpenMDException(pOVar5,&local_b8);
      __cxa_throw(pOVar5,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
    }
    local_c8 = StringTokenizer::nextTokenAsDouble(&tokenizer);
    local_d0 = StringTokenizer::nextTokenAsDouble(&tokenizer);
    local_c0 = (_func_int **)StringTokenizer::nextTokenAsDouble(&tokenizer);
    local_98 = StringTokenizer::nextTokenAsDouble(&tokenizer);
    this_00 = (SDKBendType *)operator_new(0x30);
    (this_00->super_HarmonicBendType).super_BendType.theta0_ = local_c8 * 0.017453292519943295;
    (this_00->super_HarmonicBendType).k_ = local_d0;
    (this_00->super_HarmonicBendType).super_BendType._vptr_BendType =
         (_func_int **)&PTR__UreyBradleyBendType_002bebc0;
    (this_00->smbt_).super_BondType.r0 = (RealType)local_c0;
    (this_00->smbt_).super_BondType._vptr_BondType = (_func_int **)&PTR__BondType_002bec00;
    RVar7 = local_98;
    goto LAB_001a8d8d;
  case btCubic:
    if (uVar1 < 6) {
      pOVar5 = (OpenMDException *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,"BendTypeParser: Not enough tokens",&local_d1);
      OpenMDException::OpenMDException(pOVar5,&local_b8);
      __cxa_throw(pOVar5,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
    }
    local_c8 = StringTokenizer::nextTokenAsDouble(&tokenizer);
    local_d0 = StringTokenizer::nextTokenAsDouble(&tokenizer);
    local_c0 = (_func_int **)StringTokenizer::nextTokenAsDouble(&tokenizer);
    local_98 = StringTokenizer::nextTokenAsDouble(&tokenizer);
    local_90 = StringTokenizer::nextTokenAsDouble(&tokenizer);
    this_00 = (SDKBendType *)operator_new(0x30);
    (this_00->super_HarmonicBendType).super_BendType.theta0_ = local_c8 * 0.017453292519943295;
    (this_00->super_HarmonicBendType).super_BendType._vptr_BendType =
         (_func_int **)&PTR__BendType_002bec40;
    (this_00->super_HarmonicBendType).k_ = local_d0;
    (this_00->smbt_).super_BondType._vptr_BondType = local_c0;
    (this_00->smbt_).super_BondType.r0 = local_98;
    RVar7 = local_90;
LAB_001a8d8d:
    (this_00->smbt_).sigma = RVar7;
    break;
  case btQuartic:
    if (uVar1 < 7) {
      pOVar5 = (OpenMDException *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,"BendTypeParser: Not enough tokens",&local_d1);
      OpenMDException::OpenMDException(pOVar5,&local_b8);
      __cxa_throw(pOVar5,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
    }
    local_c8 = StringTokenizer::nextTokenAsDouble(&tokenizer);
    local_d0 = StringTokenizer::nextTokenAsDouble(&tokenizer);
    local_c0 = (_func_int **)StringTokenizer::nextTokenAsDouble(&tokenizer);
    local_98 = StringTokenizer::nextTokenAsDouble(&tokenizer);
    local_90 = StringTokenizer::nextTokenAsDouble(&tokenizer);
    RVar7 = StringTokenizer::nextTokenAsDouble(&tokenizer);
    this_00 = (SDKBendType *)operator_new(0x38);
    (this_00->super_HarmonicBendType).super_BendType.theta0_ = local_c8 * 0.017453292519943295;
    (this_00->super_HarmonicBendType).super_BendType._vptr_BendType =
         (_func_int **)&PTR__BendType_002bec80;
    (this_00->super_HarmonicBendType).k_ = local_d0;
    (this_00->smbt_).super_BondType._vptr_BondType = local_c0;
    (this_00->smbt_).super_BondType.r0 = local_98;
    (this_00->smbt_).sigma = local_90;
    (this_00->smbt_).epsilon = RVar7;
    break;
  case btPolynomial:
    local_c8 = StringTokenizer::nextTokenAsDouble(&tokenizer);
    if ((uVar1 < 4) || ((uVar1 & 1) != 0)) {
      pOVar5 = (OpenMDException *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,"BendTypeParser: Not enough tokens",&local_d1);
      OpenMDException::OpenMDException(pOVar5,&local_b8);
      __cxa_throw(pOVar5,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
    }
    this_01 = (PolynomialBendType *)operator_new(0x40);
    (this_01->super_BendType).theta0_ = local_c8 * 0.017453292519943295;
    (this_01->super_BendType)._vptr_BendType = (_func_int **)&PTR__PolynomialBendType_002becc0;
    p_Var4 = &(this_01->polynomial_).polyPairMap_._M_t._M_impl.super__Rb_tree_header;
    (this_01->polynomial_).polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
         _S_red;
    (this_01->polynomial_).polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    (this_01->polynomial_).polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &p_Var4->_M_header;
    (this_01->polynomial_).polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         &p_Var4->_M_header;
    (this_01->polynomial_).polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    uVar1 = uVar1 - 2 >> 1;
    this_00 = (SDKBendType *)0x0;
    while (bVar6 = uVar1 != 0, uVar1 = uVar1 - 1, bVar6) {
      iVar3 = StringTokenizer::nextTokenAsInt(&tokenizer);
      RVar7 = StringTokenizer::nextTokenAsDouble(&tokenizer);
      PolynomialBendType::setCoefficient(this_01,iVar3,RVar7);
    }
    break;
  case btCosine:
    if (uVar1 == 2) {
      pOVar5 = (OpenMDException *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,"BendTypeParser: Not enough tokens",&local_d1);
      OpenMDException::OpenMDException(pOVar5,&local_b8);
      __cxa_throw(pOVar5,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
    }
    local_c8 = StringTokenizer::nextTokenAsDouble(&tokenizer);
    local_d0 = StringTokenizer::nextTokenAsDouble(&tokenizer);
    this_00 = (SDKBendType *)operator_new(0x20);
    (this_00->super_HarmonicBendType).super_BendType.theta0_ = local_c8 * 0.017453292519943295;
    (this_00->super_HarmonicBendType).super_BendType._vptr_BendType =
         (_func_int **)&PTR__BendType_002bed00;
    (this_00->super_HarmonicBendType).k_ = local_d0;
    pp_Var8 = (_func_int **)cos(local_c8 * 0.017453292519943295);
    (this_00->smbt_).super_BondType._vptr_BondType = pp_Var8;
    break;
  case btSDK:
    if (uVar1 < 7) {
      pOVar5 = (OpenMDException *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,"BendTypeParser: Not enough tokens",&local_d1);
      OpenMDException::OpenMDException(pOVar5,&local_b8);
      __cxa_throw(pOVar5,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
    }
    local_c8 = StringTokenizer::nextTokenAsDouble(&tokenizer);
    local_d0 = StringTokenizer::nextTokenAsDouble(&tokenizer);
    local_c0 = (_func_int **)StringTokenizer::nextTokenAsDouble(&tokenizer);
    local_98 = StringTokenizer::nextTokenAsDouble(&tokenizer);
    iVar3 = StringTokenizer::nextTokenAsInt(&tokenizer);
    mAtt = StringTokenizer::nextTokenAsInt(&tokenizer);
    this_00 = (SDKBendType *)operator_new(0x58);
    SDKBendType::SDKBendType
              (this_00,local_c8 * 0.017453292519943295,local_d0,(RealType)local_c0,local_98,iVar3,
               mAtt);
    break;
  case btCosineSeries:
    if (uVar1 == 2) {
      pOVar5 = (OpenMDException *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,"BendTypeParser: Not enough tokens",&local_d1);
      OpenMDException::OpenMDException(pOVar5,&local_b8);
      __cxa_throw(pOVar5,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
    }
    local_d0 = StringTokenizer::nextTokenAsDouble(&tokenizer);
    local_c0 = (_func_int **)StringTokenizer::nextTokenAsDouble(&tokenizer);
    this_00 = (SDKBendType *)operator_new(0x30);
    CosineSeriesBendType::CosineSeriesBendType
              ((CosineSeriesBendType *)this_00,local_d0 * 0.017453292519943295,
               (double)local_c0 * local_c8);
    break;
  case btHarmonicSine:
    local_d0 = StringTokenizer::nextTokenAsDouble(&tokenizer);
    this_00 = (SDKBendType *)operator_new(0x18);
    (this_00->super_HarmonicBendType).super_BendType.theta0_ = 0.0;
    (this_00->super_HarmonicBendType).super_BendType._vptr_BendType =
         (_func_int **)&PTR__BendType_002bee00;
    (this_00->super_HarmonicBendType).k_ = local_d0 * local_c8;
    break;
  default:
    pOVar5 = (OpenMDException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,"BendTypeParser: Unknown Bend Type",&local_d1);
    OpenMDException::OpenMDException(pOVar5,&local_b8);
    __cxa_throw(pOVar5,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
  }
  StringTokenizer::~StringTokenizer(&tokenizer);
  return (BendType *)this_00;
}

Assistant:

BendType* BendTypeParser::parseLine(const std::string& line,
                                      RealType kScale) {
    StringTokenizer tokenizer(line);
    BendType* bendType = NULL;
    int nTokens        = tokenizer.countTokens();
    RealType theta0, ktheta;
    RealType deg2rad = Constants::PI / 180.0;

    if (nTokens < 2) {
      throw OpenMDException("BendTypeParser: Not enough tokens");
    }

    BendTypeEnum bt = getBendTypeEnum(tokenizer.nextToken());
    nTokens -= 1;

    // switch is a nightmare to maintain
    switch (bt) {
    case btHarmonic:

      if (nTokens < 2) {
        throw OpenMDException("BendTypeParser: Not enough tokens");
      } else {
        theta0   = tokenizer.nextTokenAsDouble() * deg2rad;
        ktheta   = tokenizer.nextTokenAsDouble() * kScale;
        bendType = new HarmonicBendType(theta0, ktheta);
      }
      break;
    case btGhostBend:
      if (nTokens < 2) {
        throw OpenMDException("BendTypeParser: Not enough tokens");
      } else {
        theta0   = tokenizer.nextTokenAsDouble() * deg2rad;
        ktheta   = tokenizer.nextTokenAsDouble() * kScale;
        bendType = new HarmonicBendType(theta0, ktheta);
      }
      break;

    case btUreyBradley:
      if (nTokens < 4) {
        throw OpenMDException("BendTypeParser: Not enough tokens");
      } else {
        theta0       = tokenizer.nextTokenAsDouble() * deg2rad;
        ktheta       = tokenizer.nextTokenAsDouble();
        RealType s0  = tokenizer.nextTokenAsDouble();
        RealType kub = tokenizer.nextTokenAsDouble();
        bendType     = new UreyBradleyBendType(theta0, ktheta, s0, kub);
      }
      break;

    case btCubic:
      if (nTokens < 5) {
        throw OpenMDException("BendTypeParser: Not enough tokens");
      } else {
        theta0      = tokenizer.nextTokenAsDouble() * deg2rad;
        RealType k3 = tokenizer.nextTokenAsDouble();
        RealType k2 = tokenizer.nextTokenAsDouble();
        RealType k1 = tokenizer.nextTokenAsDouble();
        RealType k0 = tokenizer.nextTokenAsDouble();

        bendType = new CubicBendType(theta0, k3, k2, k1, k0);
      }
      break;

    case btQuartic:
      if (nTokens < 6) {
        throw OpenMDException("BendTypeParser: Not enough tokens");
      } else {
        theta0      = tokenizer.nextTokenAsDouble() * deg2rad;
        RealType k4 = tokenizer.nextTokenAsDouble();
        RealType k3 = tokenizer.nextTokenAsDouble();
        RealType k2 = tokenizer.nextTokenAsDouble();
        RealType k1 = tokenizer.nextTokenAsDouble();
        RealType k0 = tokenizer.nextTokenAsDouble();

        bendType = new QuarticBendType(theta0, k4, k3, k2, k1, k0);
      }
      break;

    case btPolynomial: {
      theta0 = tokenizer.nextTokenAsDouble() * deg2rad;
      nTokens -= 1;
      if (nTokens < 2 || nTokens % 2 != 0) {
        throw OpenMDException("BendTypeParser: Not enough tokens");
      } else {
        int nPairs = nTokens / 2;
        int power;
        RealType coefficient;
        PolynomialBendType* pbt = new PolynomialBendType(theta0);

        for (int i = 0; i < nPairs; ++i) {
          power       = tokenizer.nextTokenAsInt();
          coefficient = tokenizer.nextTokenAsDouble();
          pbt->setCoefficient(power, coefficient);
        }
      }
    } break;

    case btCosine:

      if (nTokens < 2) {
        throw OpenMDException("BendTypeParser: Not enough tokens");
      } else {
        theta0   = tokenizer.nextTokenAsDouble() * deg2rad;
        ktheta   = tokenizer.nextTokenAsDouble();
        bendType = new CosineBendType(theta0, ktheta);
      }
      break;

    case btSDK:
      if (nTokens < 6) {
        throw OpenMDException("BendTypeParser: Not enough tokens");
      } else {
        theta0           = tokenizer.nextTokenAsDouble() * deg2rad;
        ktheta           = tokenizer.nextTokenAsDouble();
        RealType sigma   = tokenizer.nextTokenAsDouble();
        RealType epsilon = tokenizer.nextTokenAsDouble();
        int nRep         = tokenizer.nextTokenAsInt();
        int mAtt         = tokenizer.nextTokenAsInt();
        bendType = new SDKBendType(theta0, ktheta, sigma, epsilon, nRep, mAtt);
      }
      break;

    case btCosineSeries:

      if (nTokens < 2) {
        throw OpenMDException("BendTypeParser: Not enough tokens");
      } else {
        theta0   = tokenizer.nextTokenAsDouble() * deg2rad;
        ktheta   = tokenizer.nextTokenAsDouble() * kScale;
        bendType = new CosineSeriesBendType(theta0, ktheta);
      }
      break;

    case btHarmonicSine:

      if (nTokens < 1) {
        throw OpenMDException("BendTypeParser: Not enough tokens");
      } else {
        ktheta   = tokenizer.nextTokenAsDouble() * kScale;
        bendType = new HarmonicSineBendType(ktheta);
      }
      break;

    case btUnknown:
    default:
      throw OpenMDException("BendTypeParser: Unknown Bend Type");
    }

    return bendType;
  }